

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_sizeof_bufferPool(ZSTDMT_bufferPool *bufPool)

{
  uint uVar1;
  long local_28;
  size_t totalBufferSize;
  uint u;
  size_t poolSize;
  ZSTDMT_bufferPool *bufPool_local;
  
  uVar1 = bufPool->totalBuffers;
  local_28 = 0;
  pthread_mutex_lock((pthread_mutex_t *)bufPool);
  for (totalBufferSize._4_4_ = 0; totalBufferSize._4_4_ < bufPool->totalBuffers;
      totalBufferSize._4_4_ = totalBufferSize._4_4_ + 1) {
    local_28 = bufPool->bTable[totalBufferSize._4_4_].capacity + local_28;
  }
  pthread_mutex_unlock((pthread_mutex_t *)bufPool);
  return (ulong)(uVar1 - 1) * 0x10 + 0x60 + local_28;
}

Assistant:

static size_t ZSTDMT_sizeof_bufferPool(ZSTDMT_bufferPool* bufPool)
{
    size_t const poolSize = sizeof(*bufPool)
                          + (bufPool->totalBuffers - 1) * sizeof(buffer_t);
    unsigned u;
    size_t totalBufferSize = 0;
    ZSTD_pthread_mutex_lock(&bufPool->poolMutex);
    for (u=0; u<bufPool->totalBuffers; u++)
        totalBufferSize += bufPool->bTable[u].capacity;
    ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);

    return poolSize + totalBufferSize;
}